

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

size_t __thiscall caffe::Datum::ByteSizeLong(Datum *this)

{
  uint uVar1;
  void *pvVar2;
  size_type sVar3;
  int iVar4;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) == 0) {
    sVar5 = 0;
  }
  else {
    sVar5 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize
                      ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  sVar5 = sVar5 + (ulong)(uint)(this->float_data_).current_size_ * 5;
  if ((uVar1 & 0x3f) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar3 = ((this->data_).ptr_)->_M_string_length;
      uVar6 = (uint)sVar3 | 1;
      iVar4 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar5 = sVar5 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 2) != 0) {
      if (this->channels_ < 0) {
        uVar7 = 0xb;
      }
      else {
        uVar6 = this->channels_ | 1;
        iVar4 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar7 = (ulong)((iVar4 * 9 + 0x49U >> 6) + 1);
      }
      sVar5 = sVar5 + uVar7;
    }
    if ((uVar1 & 4) != 0) {
      if (this->height_ < 0) {
        uVar7 = 0xb;
      }
      else {
        uVar6 = this->height_ | 1;
        iVar4 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar7 = (ulong)((iVar4 * 9 + 0x49U >> 6) + 1);
      }
      sVar5 = sVar5 + uVar7;
    }
    if ((uVar1 & 8) != 0) {
      if (this->width_ < 0) {
        uVar7 = 0xb;
      }
      else {
        uVar6 = this->width_ | 1;
        iVar4 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar7 = (ulong)((iVar4 * 9 + 0x49U >> 6) + 1);
      }
      sVar5 = sVar5 + uVar7;
    }
    if ((uVar1 & 0x10) != 0) {
      if (this->label_ < 0) {
        uVar7 = 0xb;
      }
      else {
        uVar6 = this->label_ | 1;
        iVar4 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar7 = (ulong)((iVar4 * 9 + 0x49U >> 6) + 1);
      }
      sVar5 = sVar5 + uVar7;
    }
    sVar5 = sVar5 + (uVar1 >> 4 & 2);
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t Datum::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.Datum)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated float float_data = 6;
  {
    unsigned int count = this->float_data_size();
    size_t data_size = 4UL * count;
    total_size += 1 *
                  ::google::protobuf::internal::FromIntSize(this->float_data_size());
    total_size += data_size;
  }

  if (_has_bits_[0 / 32] & 63u) {
    // optional bytes data = 4;
    if (has_data()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::BytesSize(
          this->data());
    }

    // optional int32 channels = 1;
    if (has_channels()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->channels());
    }

    // optional int32 height = 2;
    if (has_height()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->height());
    }

    // optional int32 width = 3;
    if (has_width()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->width());
    }

    // optional int32 label = 5;
    if (has_label()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->label());
    }

    // optional bool encoded = 7 [default = false];
    if (has_encoded()) {
      total_size += 1 + 1;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}